

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerSettings.cpp
# Opt level: O2

void __thiscall
SimpleParallelAnalyzerSettings::LoadSettings(SimpleParallelAnalyzerSettings *this,char *settings)

{
  ulong uVar1;
  long lVar2;
  Channel *this_00;
  ulong uVar3;
  SimpleArchive text_archive;
  Channel local_88 [16];
  char text [64];
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  uVar3 = (ulong)((long)(this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff;
  for (lVar2 = 0; uVar3 << 4 != lVar2; lVar2 = lVar2 + 0x10) {
    SimpleArchive::operator>>
              (&text_archive,
               (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
               super__Vector_impl_data._M_start + lVar2);
  }
  SimpleArchive::operator>>(&text_archive,&this->mClockChannel);
  SimpleArchive::operator>>(&text_archive,&this->mClockEdge);
  AnalyzerSettings::ClearChannels();
  lVar2 = 0;
  for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    sprintf(text,"D%d",uVar1 & 0xffffffff);
    this_00 = (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
              super__Vector_impl_data._M_start + lVar2;
    Channel::Channel(local_88,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    Channel::operator!=(this_00,local_88);
    AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,SUB81(text,0));
    Channel::~Channel(local_88);
    lVar2 = lVar2 + 0x10;
  }
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void SimpleParallelAnalyzerSettings::LoadSettings( const char* settings )
{
	SimpleArchive text_archive;
	text_archive.SetString( settings );

	U32 count = (U32)mDataChannels.size();

	for( U32 i=0; i<count; i++ )
	{
		text_archive >> mDataChannels[i];
	}

	text_archive >> mClockChannel;
	text_archive >> *(U32*)&mClockEdge;

	ClearChannels();
	for( U32 i=0; i<count; i++ )
	{
		char text[64];
		sprintf( text, "D%d", i );
		AddChannel( mDataChannels[i], text, mDataChannels[i] != UNDEFINED_CHANNEL );
	}

	AddChannel( mClockChannel, "Clock", true );

	UpdateInterfacesFromSettings();
}